

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::loadVectors(FastText *this,string *filename)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  real *prVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  FastText *pFVar7;
  char cVar8;
  int32_t iVar9;
  uint uVar10;
  istream *piVar11;
  ostream *poVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int64_t dim;
  int64_t n;
  string word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ifstream in;
  undefined1 local_299;
  ulong local_298;
  ulong local_290;
  undefined1 local_288 [36];
  int local_264;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  FastText *local_240;
  istream local_238 [520];
  
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Pretrained vectors file cannot be opened!",0x29);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  else {
    piVar11 = std::istream::_M_extract<long>((long *)local_238);
    std::istream::_M_extract<long>((long *)piVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Types:",6);
    poVar12 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"dim:",4);
    std::ostream::_M_insert<long>((long)poVar12);
    if (local_298 ==
        (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->dim) {
      local_288._0_8_ = (Matrix *)0x0;
      local_240 = this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,long&,long&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),(Matrix **)local_288,
                 (allocator<fasttext::Matrix> *)&local_264,(long *)&local_290,(long *)&local_298);
      uVar4 = local_288._0_8_;
      local_260 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
      if (local_290 != 0) {
        uVar14 = 0;
        do {
          local_288._0_8_ = local_288 + 0x10;
          local_288._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_288[0x10] = '\0';
          std::operator>>(local_238,(string *)local_288);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_258,(value_type *)local_288);
          if (local_298 != 0) {
            uVar13 = 0;
            do {
              std::istream::_M_extract<float>((float *)local_238);
              uVar13 = uVar13 + 1;
            } while (uVar13 < local_298);
          }
          if ((Matrix *)local_288._0_8_ != (Matrix *)(local_288 + 0x10)) {
            operator_delete((void *)local_288._0_8_);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < local_290);
      }
      this_01 = local_260;
      std::ifstream::close();
      pFVar7 = local_240;
      iVar9 = Dictionary::nwords((local_240->dict_).
                                 super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
      peVar1 = (pFVar7->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_264 = iVar9 + peVar1->bucket;
      local_288._0_8_ = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,int,int&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),(Matrix **)local_288,
                 (allocator<fasttext::Matrix> *)&local_299,&local_264,&peVar1->dim);
      uVar6 = local_288._8_8_;
      uVar5 = local_288._0_8_;
      local_288._0_8_ = (Matrix *)0x0;
      local_288._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (pFVar7->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (pFVar7->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar5;
      (pFVar7->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
        }
      }
      Matrix::uniform((pFVar7->input_).
                      super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      1.0 / (float)((pFVar7->args_).
                                    super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->dim);
      if (local_290 != 0) {
        lVar15 = 0;
        uVar14 = 0;
        do {
          uVar10 = Dictionary::getHash((pFVar7->dict_).
                                       super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,local_258.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start + uVar14);
          if (-1 < (int)uVar10) {
            iVar9 = Dictionary::nwords((pFVar7->dict_).
                                       super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
            if (((int)uVar10 <
                 iVar9 + ((pFVar7->args_).
                          super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         bucket) && (local_298 != 0)) {
              prVar2 = ((pFVar7->input_).
                        super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       data_;
              lVar3 = *(long *)uVar4;
              uVar13 = 0;
              do {
                prVar2[uVar10 * local_298 + uVar13] =
                     *(real *)(local_298 * lVar15 + lVar3 + uVar13 * 4);
                uVar13 = uVar13 + 1;
              } while (local_298 != uVar13);
            }
          }
          uVar14 = uVar14 + 1;
          lVar15 = lVar15 + 4;
        } while (uVar14 < local_290);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_258);
      std::ifstream::~ifstream(local_238);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Dimension of pretrained vectors does not match -dim option",
               0x3a);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  exit(1);
}

Assistant:

void FastText::loadVectors(std::string filename) {
  std::ifstream in(filename);
  std::vector<std::string> words;
  std::shared_ptr<Matrix> mat; // temp. matrix for pretrained vectors
  int64_t n, dim;
  if (!in.is_open()) {
    std::cerr << "Pretrained vectors file cannot be opened!" << std::endl;
    exit(EXIT_FAILURE);
  }
  in >> n >> dim;
  std::cout << "Types:" << n << "dim:" << dim;
  if (dim != args_->dim) {
    std::cerr << "Dimension of pretrained vectors does not match -dim option"
              << std::endl;
    exit(EXIT_FAILURE);
  }
  mat = std::make_shared<Matrix>(n, dim);
  for (size_t i = 0; i < n; i++) {
    std::string word;
    in >> word;
    words.push_back(word);
    //dict_->add("",word);
    for (size_t j = 0; j < dim; j++) {
      in >> mat->data_[i * dim + j];
    }
  }
  in.close();

  //dict_->threshold(1);
  input_ = std::make_shared<Matrix>(dict_->nwords()+args_->bucket, args_->dim);
  input_->uniform(1.0 / args_->dim);

  for (size_t i = 0; i < n; i++) {
    int32_t idx = dict_->getHash(words[i]);
    if (idx < 0 || idx >= dict_->nwords() + args_->bucket) continue;
    for (size_t j = 0; j < dim; j++) {
      input_->data_[idx * dim + j] = mat->data_[i * dim + j];
    }
  }
}